

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

Token * __thiscall FileTokenizer::loadToken(Token *__return_storage_ptr__,FileTokenizer *this)

{
  ulong uVar1;
  string *line;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  size_type sVar5;
  bool bVar6;
  char32_t cVar7;
  int iVar8;
  uint uVar9;
  uint7 uVar11;
  _Alloc_hider _Var12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar13;
  pointer pcVar14;
  size_type sVar15;
  char cVar16;
  ulong uVar17;
  size_t sVar18;
  allocator<char> local_9d;
  uint local_9c;
  uint local_98;
  uint local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  uint local_84;
  string text;
  ulong local_58;
  double value_1;
  ulong uVar10;
  
  bVar6 = isInputAtEnd(this);
  if (bVar6) {
    createToken(this,Invalid,0);
    goto LAB_00145301;
  }
  sVar18 = this->linePos;
  if (this->equActive == true) {
    while ((sVar18 < (this->currentLine)._M_string_length &&
           (bVar6 = isComment(&this->currentLine,sVar18), !bVar6))) {
      sVar18 = sVar18 + 1;
    }
    createTokenCurrentString(this,EquValue,sVar18 - this->linePos);
    this->equActive = false;
    goto LAB_00145301;
  }
  bVar6 = parseOperator(this);
  if (bVar6) goto LAB_00145301;
  line = &this->currentLine;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (this->currentLine)._M_dataplus._M_p;
  bVar2 = *(byte *)((long)&(local_90->_M_dataplus)._M_p + sVar18);
  if (bVar2 == 0x22) {
    text._M_dataplus._M_p = (pointer)&text.field_2;
    text._M_string_length = 0;
    text.field_2._M_local_buf[0] = '\0';
    uVar13 = sVar18 + 1;
    while (uVar4 = (this->currentLine)._M_string_length, uVar13 < uVar4) {
      uVar17 = uVar13 + 1;
      pcVar14 = (line->_M_dataplus)._M_p;
      cVar3 = pcVar14[uVar13];
      cVar16 = (char)&text;
      if (cVar3 == '\\' && uVar17 < uVar4) {
        cVar3 = pcVar14[uVar17];
        if (cVar3 == '\\') {
          std::__cxx11::string::push_back(cVar16);
        }
        else {
          if (cVar3 != '\"') goto LAB_00145394;
          std::__cxx11::string::push_back(cVar16);
        }
        uVar13 = uVar13 + 2;
      }
      else {
        if (cVar3 == '\"') {
          createToken(this,String,uVar17 - this->linePos,&text);
          goto LAB_001457af;
        }
LAB_00145394:
        std::__cxx11::string::push_back(cVar16);
        uVar13 = uVar17;
      }
    }
    sVar18 = this->linePos;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value_1,"Unexpected end of line in string constant",&local_9d);
    createToken(this,Invalid,uVar13 - sVar18,(string *)&value_1);
    std::__cxx11::string::~string((string *)&value_1);
    goto LAB_001457af;
  }
  if (bVar2 == 0x27) {
    text._M_dataplus._M_p = (pointer)(sVar18 + 1);
    cVar7 = anon_unknown.dwarf_13af85::decodeUtf8Character(line,(size_t *)&text);
    args = local_90;
    if (text._M_dataplus._M_p[(long)&local_90->_M_dataplus] == '\'') {
      pcVar14 = text._M_dataplus._M_p + (1 - sVar18);
      _Var12._M_p = (pointer)(ulong)(uint)cVar7;
LAB_001452dd:
      createToken(this,Integer,(size_t)pcVar14,(int64_t)_Var12._M_p);
LAB_00145301:
      Token::Token(__return_storage_ptr__,&this->token);
      return __return_storage_ptr__;
    }
  }
  else {
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)(bVar2 - 0x30);
    if ((byte)(bVar2 - 0x30) < 10) {
      uVar13 = sVar18 + 1;
      uVar4 = (this->currentLine)._M_string_length;
      uVar17 = 0;
      if (bVar2 == 0x30 && uVar13 < uVar4) {
        iVar8 = tolower((int)*(char *)((long)&(local_90->_M_dataplus)._M_p + uVar13));
        local_9c = CONCAT31((int3)((uint)iVar8 >> 8),iVar8 == 0x78);
        uVar17 = (ulong)local_9c;
      }
      else {
        local_9c = 0;
      }
      local_98 = (uint)CONCAT71((int7)(uVar17 >> 8),1);
      local_84 = 0;
      bVar6 = false;
      local_94 = 0;
      for (uVar17 = sVar18; uVar17 < uVar4; uVar17 = uVar17 + 1) {
        cVar3 = *(char *)((long)&(local_90->_M_dataplus)._M_p + uVar17);
        iVar8 = isalnum((int)cVar3);
        if (iVar8 == 0) {
          if (cVar3 != '.') break;
LAB_0014560f:
          uVar11 = (uint7)(uint3)((uint)iVar8 >> 8);
          if ((bVar6) || ((local_94 & 1) != 0)) {
            local_94 = (uint)CONCAT71(uVar11,1);
            local_98 = 0;
          }
          else {
            local_94 = (uint)CONCAT71(uVar11,1);
          }
        }
        else {
          if (cVar3 == '.') goto LAB_0014560f;
          iVar8 = tolower((int)cVar3);
          if (iVar8 == 0x65) {
            if ((local_9c & 1) == 0) {
              if (bVar6 == false) {
                uVar1 = uVar17 + 1;
                if (uVar1 < uVar4) {
                  cVar3 = *(char *)((long)&(local_90->_M_dataplus)._M_p + uVar1);
                  uVar10 = 0;
                  if ((cVar3 == '-') || (cVar3 == '+')) {
                    if (uVar17 + 2 < uVar4) {
                      uVar9 = isalnum((int)*(char *)((long)&(local_90->_M_dataplus)._M_p +
                                                    uVar17 + 2));
                      uVar10 = (ulong)uVar9;
                      uVar13 = CONCAT71((int7)(uVar13 >> 8),1);
                      local_84 = (uint)uVar13;
                      if (uVar9 == 0) goto LAB_00145692;
                    }
                    else {
LAB_00145692:
                      local_84 = (uint)CONCAT71((int7)(uVar10 >> 8),1);
                      local_98 = 0;
                    }
                    bVar6 = true;
                    uVar17 = uVar1;
                    goto LAB_001456b1;
                  }
                }
              }
              else {
                local_98 = 0;
              }
              bVar6 = true;
            }
          }
          else if (iVar8 == 0x68) {
            local_9c = local_9c & 0xff;
            uVar13 = 0;
            if ((local_84 & 1) == 0) {
              local_9c = 1;
            }
          }
        }
LAB_001456b1:
      }
      if (((local_94 & 1) == 0) && ((bVar6 & ((byte)local_9c ^ 1)) == 0)) {
        bVar6 = stringToInt(line,sVar18,uVar17,(int64_t *)&text);
        pcVar14 = (pointer)(uVar17 - sVar18);
        _Var12 = text._M_dataplus;
        if (bVar6) goto LAB_001452dd;
      }
      else {
        if ((local_98 & 1) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&text,"Invalid floating point number",&local_9d);
          createToken(this,Invalid,uVar17 - sVar18,&text);
          std::__cxx11::string::~string((string *)&text);
          goto LAB_00145301;
        }
        bVar6 = convertFloat(this,sVar18,uVar17,&value_1);
        pcVar14 = (pointer)(uVar17 - sVar18);
        if (bVar6) {
          createToken(this,Float,(size_t)pcVar14,value_1);
          goto LAB_00145301;
        }
      }
      createTokenCurrentString(this,NumberString,(size_t)pcVar14);
      goto LAB_00145301;
    }
  }
  bVar6 = true;
  for (; sVar18 < (this->currentLine)._M_string_length; sVar18 = sVar18 + 1) {
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (line->_M_dataplus)._M_p;
    bVar6 = SymbolTable::isValidSymbolCharacter
                      (*(char *)((long)&(args->_M_dataplus)._M_p + sVar18),bVar6);
    if (!bVar6) break;
    bVar6 = false;
  }
  local_58 = sVar18;
  if (this->linePos == sVar18) {
    cVar7 = anon_unknown.dwarf_13af85::decodeUtf8Character(line,&local_58);
    convertUnicodeCharToUtf8_abi_cxx11_((string *)&value_1,cVar7);
    tinyformat::format<std::__cxx11::string>
              (&text,(tinyformat *)"Invalid input \'%s\'",(char *)&value_1,args);
    std::__cxx11::string::~string((string *)&value_1);
    createToken(this,Invalid,local_58 - sVar18,&text);
  }
  else {
    std::__cxx11::string::substr((ulong)&text,(ulong)line);
    bVar6 = std::
            any_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(unsigned_int)noexcept>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )text._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(text._M_dataplus._M_p + text._M_string_length),iswupper);
    sVar5 = text._M_string_length;
    _Var12 = text._M_dataplus;
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(local_90._1_7_,bVar6);
    if (bVar6) {
      for (sVar15 = 0; sVar5 != sVar15; sVar15 = sVar15 + 1) {
        iVar8 = tolower((int)_Var12._M_p[sVar15]);
        _Var12._M_p[sVar15] = (char)iVar8;
      }
    }
    bVar6 = std::operator==(&text,"equ");
    sVar18 = sVar18 - this->linePos;
    if (bVar6) {
      createToken(this,Equ,sVar18);
      this->equActive = true;
    }
    else if ((char)local_90 == '\0') {
      createTokenCurrentString(this,Identifier,sVar18);
    }
    else {
      createToken(this,Identifier,sVar18,&text);
    }
  }
LAB_001457af:
  Token::Token(__return_storage_ptr__,&this->token);
  std::__cxx11::string::~string((string *)&text);
  return __return_storage_ptr__;
}

Assistant:

Token FileTokenizer::loadToken()
{
	if (isInputAtEnd())
	{
		createToken(TokenType::Invalid,0);
		return std::move(token);
	}

	size_t pos = linePos;

	if (equActive)
	{
		while (pos < currentLine.size() && !isComment(currentLine,pos))
			pos++;

		createTokenCurrentString(TokenType::EquValue,pos-linePos);

		equActive = false;
		return std::move(token);
	}

	if (parseOperator())
		return std::move(token);

	char first = currentLine[pos];

	// character constants
	if (first == '\'')
	{
		size_t decodePos = pos+1;

		auto value = int64_t(decodeUtf8Character(currentLine, decodePos));
		if (currentLine[decodePos] == '\'')
		{
			createToken(TokenType::Integer,decodePos+1-pos,value);
			return std::move(token);
		}
	}

	// strings
	if (first == '"')
	{
		std::string text;
		pos++;

		bool valid = false;
		while (pos < currentLine.size())
		{
			if (pos+1 < currentLine.size() && currentLine[pos] == '\\')
			{
				if (currentLine[pos+1] == '"')
				{
					text += '"';
					pos += 2;
					continue;
				}
				
				if (currentLine[pos+1] == '\\')
				{
					text += '\\';
					pos += 2;
					continue;
				}
			}

			if (currentLine[pos] == '"')
			{
				pos++;
				valid = true;
				break;
			}

			text += currentLine[pos++];
		}

		if (!valid)
		{
			createToken(TokenType::Invalid,pos-linePos, "Unexpected end of line in string constant");
			return std::move(token);
		}
		
		createToken(TokenType::String,pos-linePos,text);
		return std::move(token);
	}

	// numbers
	if (first >= '0' && first <= '9')
	{
		// find end of number
		size_t start = pos;
		size_t end = pos;
		bool isValid = true;
		bool foundPoint = false;
		bool foundExp = false;
		bool foundExpSign = false;
		bool isHex = start+1 < currentLine.size() && currentLine[start] == '0' && tolower(currentLine[start+1]) == 'x';

		while (end < currentLine.size() && (isalnum(currentLine[end]) || currentLine[end] == '.'))
		{
			if (currentLine[end] == '.')
			{
				if (foundExp || foundPoint)
					isValid = false;
				foundPoint = true;
			} else if (tolower(currentLine[end]) == 'h' && !foundExpSign) {
				isHex = true;
			} else if (tolower(currentLine[end]) == 'e' && !isHex)
			{
				if (foundExp)
				{
					isValid = false;
				} else if (end+1 < currentLine.size() && (currentLine[end+1] == '+' || currentLine[end+1] == '-')){
					end++;
					if (end+1 >= currentLine.size() || !isalnum(currentLine[end+1]))
						isValid = false;
					foundExpSign = true;
				}
				foundExp = true;
			}

			end++;
		}

		bool isFloat = foundPoint || (foundExp && !isHex);

		if (!isFloat)
		{
			int64_t value;
			if (!convertInteger(start,end,value))
			{
				createTokenCurrentString(TokenType::NumberString,end-start);
				return std::move(token);
			}

			createToken(TokenType::Integer,end-start,value);
		} else { // isFloat
			double value;
			if (!isValid)
			{
				createToken(TokenType::Invalid,end-start, "Invalid floating point number");
				return std::move(token);
			}

			if (!convertFloat(start,end,value))
			{
				createTokenCurrentString(TokenType::NumberString,end-start);
				return std::move(token);
			}

			createToken(TokenType::Float,end-start,value);
		}
		
		return std::move(token);
	}

	// identifiers
	bool isFirst = true;
	while (pos < currentLine.size() && Global.symbolTable.isValidSymbolCharacter(currentLine[pos],isFirst))
	{
		pos++;
		isFirst = false;
	}

	if (pos == linePos)
	{
		auto characterStart = pos;
		auto value = decodeUtf8Character(currentLine, pos);
		std::string text = tfm::format("Invalid input '%s'",convertUnicodeCharToUtf8(value));
		createToken(TokenType::Invalid,pos-characterStart,text);
		return std::move(token);
	}

	std::string text = currentLine.substr(linePos,pos-linePos);
	bool textLowered = false;
	// Lowercase is common, let's try to avoid a copy.
	if (std::any_of(text.begin(), text.end(), ::iswupper))
	{
		std::transform(text.begin(), text.end(), text.begin(), ::tolower);
		textLowered = true;
	}

	if (text == "equ")
	{
		createToken(TokenType::Equ,pos-linePos);
		equActive = true;
	} else if (textLowered) {
		createToken(TokenType::Identifier,pos-linePos,text);
	} else {
		createTokenCurrentString(TokenType::Identifier,pos-linePos);
	}

	return std::move(token);
}